

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnectionchannel.cpp
# Opt level: O3

void __thiscall
QHttpNetworkConnectionChannel::resendCurrentRequest(QHttpNetworkConnectionChannel *this)

{
  long lVar1;
  QObject *pQVar2;
  long in_FS_OFFSET;
  void *local_28;
  char *pcStack_20;
  QMetaTypeInterface *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  requeueCurrentlyPipelinedRequests(this);
  if (*(long *)(this + 0x38) != 0) {
    this[0x50] = (QHttpNetworkConnectionChannel)0x1;
  }
  lVar1 = QMetaObject::cast((QObject *)&QHttpNetworkConnection::staticMetaObject);
  if (lVar1 != 0) {
    if ((*(long *)(this + 0xf0) == 0) || (*(int *)(*(long *)(this + 0xf0) + 4) == 0)) {
      pQVar2 = (QObject *)0x0;
    }
    else {
      pQVar2 = *(QObject **)(this + 0xf8);
    }
    local_28 = (void *)0x0;
    pcStack_20 = (char *)0x0;
    local_18 = (QMetaTypeInterface *)0x0;
    QMetaObject::invokeMethodImpl
              (pQVar2,"_q_startNextRequest",QueuedConnection,1,&local_28,&pcStack_20,&local_18);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QHttpNetworkConnectionChannel::resendCurrentRequest()
{
    requeueCurrentlyPipelinedRequests();
    if (reply)
        resendCurrent = true;
    if (qobject_cast<QHttpNetworkConnection*>(connection))
        QMetaObject::invokeMethod(connection, "_q_startNextRequest", Qt::QueuedConnection);
}